

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9EquivMark(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint local_3c;
  uint local_38;
  int fSkipSome;
  int fVerbose;
  int c;
  char *pFileName;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  local_38 = 0;
  local_3c = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"fvh"), iVar1 != -1) {
    if (iVar1 == 0x66) {
      local_3c = local_3c ^ 1;
    }
    else {
      if ((iVar1 == 0x68) || (iVar1 != 0x76)) goto LAB_002ad454;
      local_38 = local_38 ^ 1;
    }
  }
  if (pAbc->pGia == (Gia_Man_t *)0x0) {
    Abc_Print(-1,"Abc_CommandAbc9EquivMark(): There is no AIG.\n");
    pAbc_local._4_4_ = 1;
  }
  else if (argc == globalUtilOptind + 1) {
    Gia_ManEquivMark(pAbc->pGia,argv[globalUtilOptind],local_3c,local_38);
    pAbc_local._4_4_ = 0;
  }
  else {
LAB_002ad454:
    Abc_Print(-2,"usage: &equiv_mark [-fvh] <miter.aig>\n");
    Abc_Print(-2,"\t              marks equivalences using an external miter\n");
    pcVar2 = "no";
    if (local_3c != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-f          : toggle the use of filtered equivalences [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if (local_38 != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-v          : toggle printing verbose information [default = %s]\n",pcVar2);
    Abc_Print(-2,"\t-h          : print the command usage\n");
    Abc_Print(-2,"\t<miter.aig> : file with the external miter to read\n");
    Abc_Print(-2,"\t              \n");
    Abc_Print(-2,"\t              The external miter should be generated by &srm -s\n");
    Abc_Print(-2,"\t              and (partially) solved by any verification engine(s).\n");
    Abc_Print(-2,"\t              The external miter should have as many POs as\n");
    Abc_Print(-2,"\t              the number of POs in the current AIG plus\n");
    Abc_Print(-2,"\t              the number of equivalences in the current AIG.\n");
    Abc_Print(-2,"\t              If some POs are proved, the corresponding equivs\n");
    Abc_Print(-2,"\t              are marked as proved, to be reduced by &reduce.\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandAbc9EquivMark( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManEquivMark( Gia_Man_t * p, char * pFileName, int fSkipSome, int fVerbose );
    char * pFileName;
    int c, fVerbose = 0;
    int fSkipSome = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "fvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'f':
            fSkipSome ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9EquivMark(): There is no AIG.\n" );
        return 1;
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pFileName = argv[globalUtilOptind];
    // mark equivalences
    Gia_ManEquivMark( pAbc->pGia, pFileName, fSkipSome, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &equiv_mark [-fvh] <miter.aig>\n" );
    Abc_Print( -2, "\t              marks equivalences using an external miter\n" );
    Abc_Print( -2, "\t-f          : toggle the use of filtered equivalences [default = %s]\n", fSkipSome? "yes": "no" );
    Abc_Print( -2, "\t-v          : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h          : print the command usage\n");
    Abc_Print( -2, "\t<miter.aig> : file with the external miter to read\n");
    Abc_Print( -2, "\t              \n" );
    Abc_Print( -2, "\t              The external miter should be generated by &srm -s\n" );
    Abc_Print( -2, "\t              and (partially) solved by any verification engine(s).\n" );
    Abc_Print( -2, "\t              The external miter should have as many POs as\n" );
    Abc_Print( -2, "\t              the number of POs in the current AIG plus\n" );
    Abc_Print( -2, "\t              the number of equivalences in the current AIG.\n" );
    Abc_Print( -2, "\t              If some POs are proved, the corresponding equivs\n" );
    Abc_Print( -2, "\t              are marked as proved, to be reduced by &reduce.\n" );
    return 1;
}